

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::start_connecting(session_base_t *this,bool wait_)

{
  options_t *options_;
  int iVar1;
  uint uVar2;
  io_thread_t *io_thread_;
  socks_connecter_t *this_00;
  address_t *this_01;
  ctx_t *parent_;
  udp_engine_t *this_02;
  string local_50;
  
  if (this->_active == false) {
    start_connecting();
  }
  io_thread_ = object_t::choose_io_thread((object_t *)this,(this->super_own_t).options.affinity);
  if (io_thread_ == (io_thread_t *)0x0) {
    start_connecting();
  }
  options_ = &(this->super_own_t).options;
  iVar1 = std::__cxx11::string::compare((char *)this->_addr);
  if (iVar1 == 0) {
    if ((this->super_own_t).options.socks_proxy_address._M_string_length != 0) {
      this_01 = (address_t *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (this_01 == (address_t *)0x0) {
        this_01 = (address_t *)0x0;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,&protocol_name::tcp,0x20d677);
        parent_ = object_t::get_ctx((object_t *)this);
        address_t::address_t
                  (this_01,&local_50,&(this->super_own_t).options.socks_proxy_address,parent_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (this_01 == (address_t *)0x0) {
        start_connecting();
      }
      this_00 = (socks_connecter_t *)operator_new(0xb98,(nothrow_t *)&std::nothrow);
      if (this_00 == (socks_connecter_t *)0x0) {
        this_00 = (socks_connecter_t *)0x0;
      }
      else {
        socks_connecter_t::socks_connecter_t
                  (this_00,io_thread_,this,options_,this->_addr,this_01,wait_);
      }
      if (this_00 == (socks_connecter_t *)0x0) {
        start_connecting();
      }
      if ((this->super_own_t).options.socks_proxy_username._M_string_length != 0) {
        socks_connecter_t::set_auth_method_basic
                  (this_00,&(this->super_own_t).options.socks_proxy_username,
                   &(this->super_own_t).options.socks_proxy_password);
      }
      goto LAB_001f38c6;
    }
    this_00 = (socks_connecter_t *)operator_new(0x5d0,(nothrow_t *)&std::nothrow);
    if (this_00 != (socks_connecter_t *)0x0) {
      tcp_connecter_t::tcp_connecter_t
                ((tcp_connecter_t *)this_00,io_thread_,this,options_,this->_addr,wait_);
      goto LAB_001f38c6;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)this->_addr);
    if (iVar1 == 0) {
      this_00 = (socks_connecter_t *)operator_new(0x5c8,(nothrow_t *)&std::nothrow);
      if (this_00 != (socks_connecter_t *)0x0) {
        ipc_connecter_t::ipc_connecter_t
                  ((ipc_connecter_t *)this_00,io_thread_,this,options_,this->_addr,wait_);
        goto LAB_001f38c6;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)this->_addr);
      if ((iVar1 == 0) &&
         (this_00 = (socks_connecter_t *)operator_new(0x5c8,(nothrow_t *)&std::nothrow),
         this_00 != (socks_connecter_t *)0x0)) {
        tipc_connecter_t::tipc_connecter_t
                  ((tipc_connecter_t *)this_00,io_thread_,this,options_,this->_addr,wait_);
        goto LAB_001f38c6;
      }
    }
  }
  this_00 = (socks_connecter_t *)0x0;
LAB_001f38c6:
  if (this_00 == (socks_connecter_t *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)this->_addr);
    if (iVar1 == 0) {
      uVar2 = (uint)(byte)(this->super_own_t).options.type;
      if ((0x12 < uVar2) || ((0x4c000U >> (uVar2 & 0x1f) & 1) == 0)) {
        start_connecting();
      }
      this_02 = (udp_engine_t *)operator_new(0x4598,(nothrow_t *)&std::nothrow);
      if (this_02 == (udp_engine_t *)0x0) {
        this_02 = (udp_engine_t *)0x0;
      }
      else {
        udp_engine_t::udp_engine_t(this_02,options_);
      }
      if (this_02 == (udp_engine_t *)0x0) {
        start_connecting();
      }
      iVar1 = udp_engine_t::init(this_02,(EVP_PKEY_CTX *)this->_addr);
      if (iVar1 != 0) {
        start_connecting();
      }
      object_t::send_attach((object_t *)this,this,&this_02->super_i_engine,true);
    }
    else {
      start_connecting();
    }
  }
  else {
    own_t::launch_child(&this->super_own_t,(own_t *)this_00);
  }
  return;
}

Assistant:

void zmq::session_base_t::start_connecting (bool wait_)
{
    zmq_assert (_active);

    //  Choose I/O thread to run connecter in. Given that we are already
    //  running in an I/O thread, there must be at least one available.
    io_thread_t *io_thread = choose_io_thread (options.affinity);
    zmq_assert (io_thread);

    //  Create the connecter object.
    own_t *connecter = NULL;
    if (_addr->protocol == protocol_name::tcp) {
        if (!options.socks_proxy_address.empty ()) {
            address_t *proxy_address = new (std::nothrow)
              address_t (protocol_name::tcp, options.socks_proxy_address,
                         this->get_ctx ());
            alloc_assert (proxy_address);
            connecter = new (std::nothrow) socks_connecter_t (
              io_thread, this, options, _addr, proxy_address, wait_);
            alloc_assert (connecter);
            if (!options.socks_proxy_username.empty ()) {
                reinterpret_cast<socks_connecter_t *> (connecter)
                  ->set_auth_method_basic (options.socks_proxy_username,
                                           options.socks_proxy_password);
            }
        } else {
            connecter = new (std::nothrow)
              tcp_connecter_t (io_thread, this, options, _addr, wait_);
        }
    }
#if defined ZMQ_HAVE_IPC
    else if (_addr->protocol == protocol_name::ipc) {
        connecter = new (std::nothrow)
          ipc_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_TIPC
    else if (_addr->protocol == protocol_name::tipc) {
        connecter = new (std::nothrow)
          tipc_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_VMCI
    else if (_addr->protocol == protocol_name::vmci) {
        connecter = new (std::nothrow)
          vmci_connecter_t (io_thread, this, options, _addr, wait_);
    }
#endif
#if defined ZMQ_HAVE_WS
    else if (_addr->protocol == protocol_name::ws) {
        connecter = new (std::nothrow) ws_connecter_t (
          io_thread, this, options, _addr, wait_, false, std::string ());
    }
#endif
#if defined ZMQ_HAVE_WSS
    else if (_addr->protocol == protocol_name::wss) {
        connecter = new (std::nothrow) ws_connecter_t (
          io_thread, this, options, _addr, wait_, true, _wss_hostname);
    }
#endif
    if (connecter != NULL) {
        alloc_assert (connecter);
        launch_child (connecter);
        return;
    }

    if (_addr->protocol == protocol_name::udp) {
        zmq_assert (options.type == ZMQ_DISH || options.type == ZMQ_RADIO
                    || options.type == ZMQ_DGRAM);

        udp_engine_t *engine = new (std::nothrow) udp_engine_t (options);
        alloc_assert (engine);

        bool recv = false;
        bool send = false;

        if (options.type == ZMQ_RADIO) {
            send = true;
            recv = false;
        } else if (options.type == ZMQ_DISH) {
            send = false;
            recv = true;
        } else if (options.type == ZMQ_DGRAM) {
            send = true;
            recv = true;
        }

        int rc = engine->init (_addr, send, recv);
        errno_assert (rc == 0);

        send_attach (this, engine);

        return;
    }

#ifdef ZMQ_HAVE_OPENPGM

    //  Both PGM and EPGM transports are using the same infrastructure.
    if (_addr->protocol == "pgm" || _addr->protocol == "epgm") {
        zmq_assert (options.type == ZMQ_PUB || options.type == ZMQ_XPUB
                    || options.type == ZMQ_SUB || options.type == ZMQ_XSUB);

        //  For EPGM transport with UDP encapsulation of PGM is used.
        bool const udp_encapsulation = _addr->protocol == "epgm";

        //  At this point we'll create message pipes to the session straight
        //  away. There's no point in delaying it as no concept of 'connect'
        //  exists with PGM anyway.
        if (options.type == ZMQ_PUB || options.type == ZMQ_XPUB) {
            //  PGM sender.
            pgm_sender_t *pgm_sender =
              new (std::nothrow) pgm_sender_t (io_thread, options);
            alloc_assert (pgm_sender);

            int rc =
              pgm_sender->init (udp_encapsulation, _addr->address.c_str ());
            errno_assert (rc == 0);

            send_attach (this, pgm_sender);
        } else {
            //  PGM receiver.
            pgm_receiver_t *pgm_receiver =
              new (std::nothrow) pgm_receiver_t (io_thread, options);
            alloc_assert (pgm_receiver);

            int rc =
              pgm_receiver->init (udp_encapsulation, _addr->address.c_str ());
            errno_assert (rc == 0);

            send_attach (this, pgm_receiver);
        }

        return;
    }
#endif

#ifdef ZMQ_HAVE_NORM
    if (_addr->protocol == "norm") {
        //  At this point we'll create message pipes to the session straight
        //  away. There's no point in delaying it as no concept of 'connect'
        //  exists with NORM anyway.
        if (options.type == ZMQ_PUB || options.type == ZMQ_XPUB) {
            //  NORM sender.
            norm_engine_t *norm_sender =
              new (std::nothrow) norm_engine_t (io_thread, options);
            alloc_assert (norm_sender);

            int rc = norm_sender->init (_addr->address.c_str (), true, false);
            errno_assert (rc == 0);

            send_attach (this, norm_sender);
        } else { // ZMQ_SUB or ZMQ_XSUB

            //  NORM receiver.
            norm_engine_t *norm_receiver =
              new (std::nothrow) norm_engine_t (io_thread, options);
            alloc_assert (norm_receiver);

            int rc = norm_receiver->init (_addr->address.c_str (), false, true);
            errno_assert (rc == 0);

            send_attach (this, norm_receiver);
        }
        return;
    }
#endif // ZMQ_HAVE_NORM

    zmq_assert (false);
}